

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O0

boolean validate_object(obj *obj,char *lets,char *word)

{
  obj_use_status oVar1;
  char *pcVar2;
  bool bVar3;
  boolean allowall;
  char *word_local;
  char *lets_local;
  obj *obj_local;
  
  bVar3 = true;
  if (lets != (char *)0x0) {
    pcVar2 = strchr(lets,0x14);
    bVar3 = pcVar2 != (char *)0x0;
  }
  if (((bVar3) || (lets == (char *)0x0)) ||
     (pcVar2 = strchr(lets,(int)obj->oclass), pcVar2 != (char *)0x0)) {
    oVar1 = object_selection_checks(obj,word);
    switch(oVar1) {
    case OBJECT_USABLE:
    case CURRENTLY_NOT_USABLE:
      obj_local._7_1_ = '\x01';
      break;
    default:
      silly_thing(word,obj);
      obj_local._7_1_ = '\0';
      break;
    case ARMOR_TAKEOFF_BLOCKED:
      pline("The rest of your armor is in the way.");
      obj_local._7_1_ = '\0';
    }
  }
  else {
    silly_thing(word,obj);
    obj_local._7_1_ = '\0';
  }
  return obj_local._7_1_;
}

Assistant:

boolean validate_object(struct obj *obj, const char *lets, const char *word)
{
	boolean allowall = !lets || !!strchr(lets, ALL_CLASSES);
	if (!allowall && lets && !strchr(lets, obj->oclass)) {
	    silly_thing(word, obj);
	    return FALSE;
	}

	switch (object_selection_checks(obj, word)) {
	    default:
	    case ALREADY_IN_USE:
	    case UNSUITABLE_USE:
		silly_thing(word, obj);
		return FALSE;

	    case ARMOR_TAKEOFF_BLOCKED:
		pline("The rest of your armor is in the way.");
		return FALSE;

	    case OBJECT_USABLE:
	    case CURRENTLY_NOT_USABLE:
		return TRUE;
	}
}